

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * gravity_parser_run(gravity_parser_t *parser,gravity_delegate_t *delegate)

{
  lexer_r *plVar1;
  size_t sVar2;
  gravity_lexer_t *pgVar3;
  gravity_delegate_t *pgVar4;
  double dVar5;
  gtoken_t gVar6;
  char *pcVar7;
  size_t len;
  gravity_lexer_t *pgVar8;
  gravity_lexer_t **ppgVar9;
  char **ppcVar10;
  gnode_r *pgVar11;
  gnode_t *pgVar12;
  gnode_t **ppgVar13;
  nanotime_t tstart;
  nanotime_t tend;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  
  parser->delegate = delegate;
  gravity_lexer_setdelegate(parser->lexer->p[parser->lexer->n - 1],delegate);
  if ((((delegate != (gravity_delegate_t *)0x0) &&
       (delegate->precode_callback != (gravity_precode_callback)0x0)) &&
      (pcVar7 = (*delegate->precode_callback)(delegate->xdata), pcVar7 != (char *)0x0)) &&
     ((len = strlen(pcVar7), len != 0 &&
      (pgVar8 = gravity_lexer_create(pcVar7,len,0,true), pgVar8 != (gravity_lexer_t *)0x0)))) {
    plVar1 = parser->lexer;
    sVar16 = plVar1->n;
    sVar2 = plVar1->m;
    sVar15 = sVar16 - 1;
    plVar1->n = sVar15;
    pgVar3 = plVar1->p[sVar16 - 1];
    if (sVar15 == sVar2) {
      sVar15 = 8;
      if (sVar2 != 0) {
        sVar15 = sVar2 * 2;
      }
      plVar1->m = sVar15;
      ppgVar9 = (gravity_lexer_t **)realloc(plVar1->p,sVar15 << 3);
      parser->lexer->p = ppgVar9;
    }
    plVar1 = parser->lexer;
    sVar15 = plVar1->n;
    plVar1->n = sVar15 + 1;
    plVar1->p[sVar15] = pgVar8;
    plVar1 = parser->lexer;
    sVar15 = plVar1->m;
    if (plVar1->n == sVar15) {
      sVar16 = 8;
      if (sVar15 != 0) {
        sVar16 = sVar15 * 2;
      }
      plVar1->m = sVar16;
      ppgVar9 = (gravity_lexer_t **)realloc(plVar1->p,sVar16 << 3);
      parser->lexer->p = ppgVar9;
    }
    plVar1 = parser->lexer;
    sVar15 = plVar1->n;
    plVar1->n = sVar15 + 1;
    plVar1->p[sVar15] = pgVar3;
  }
  ppcVar10 = gravity_core_identifiers();
  pgVar11 = gnode_array_create();
  pcVar7 = *ppcVar10;
  if (pcVar7 != (char *)0x0) {
    uVar14 = 1;
    do {
      pcVar7 = string_dup(pcVar7);
      sVar15 = parser->declarations->n;
      if (sVar15 == 0) {
        pgVar12 = (gnode_t *)0x0;
      }
      else {
        pgVar12 = parser->declarations->p[sVar15 - 1];
      }
      pgVar12 = gnode_variable_create
                          ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar7,(char *)0x0,(gnode_t *)0x0,pgVar12,
                           (gnode_variable_decl_t *)0x0);
      sVar15 = pgVar11->m;
      if (pgVar11->n == sVar15) {
        sVar16 = sVar15 * 2;
        if (sVar15 == 0) {
          sVar16 = 8;
        }
        pgVar11->m = sVar16;
        ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
        pgVar11->p = ppgVar13;
      }
      sVar15 = pgVar11->n;
      pgVar11->n = sVar15 + 1;
      pgVar11->p[sVar15] = pgVar12;
      pcVar7 = ppcVar10[uVar14];
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (pcVar7 != (char *)0x0);
  }
  sVar15 = parser->declarations->n;
  if (sVar15 == 0) {
    pgVar12 = (gnode_t *)0x0;
  }
  else {
    pgVar12 = parser->declarations->p[sVar15 - 1];
  }
  pgVar12 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar11,
                       pgVar12);
  pgVar11 = parser->statements;
  sVar15 = pgVar11->m;
  if (pgVar11->n == sVar15) {
    sVar16 = 8;
    if (sVar15 != 0) {
      sVar16 = sVar15 * 2;
    }
    pgVar11->m = sVar16;
    ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
    parser->statements->p = ppgVar13;
  }
  pgVar11 = parser->statements;
  sVar15 = pgVar11->n;
  pgVar11->n = sVar15 + 1;
  pgVar11->p[sVar15] = pgVar12;
  pcVar7 = "Math";
  lVar17 = 0;
  pgVar11 = gnode_array_create();
  do {
    pcVar7 = string_dup(pcVar7);
    sVar15 = parser->declarations->n;
    if (sVar15 == 0) {
      pgVar12 = (gnode_t *)0x0;
    }
    else {
      pgVar12 = parser->declarations->p[sVar15 - 1];
    }
    pgVar12 = gnode_variable_create
                        ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar7,(char *)0x0,(gnode_t *)0x0,pgVar12,
                         (gnode_variable_decl_t *)0x0);
    sVar15 = pgVar11->m;
    if (pgVar11->n == sVar15) {
      sVar16 = sVar15 * 2;
      if (sVar15 == 0) {
        sVar16 = 8;
      }
      pgVar11->m = sVar16;
      ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
      pgVar11->p = ppgVar13;
    }
    sVar15 = pgVar11->n;
    pgVar11->n = sVar15 + 1;
    pgVar11->p[sVar15] = pgVar12;
    pcVar7 = *(char **)(gravity_optional_identifiers_list + lVar17 * 8 + 8);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  pgVar4 = parser->delegate;
  if ((pgVar4 != (gravity_delegate_t *)0x0) &&
     (pgVar4->optional_classes != (gravity_optclass_callback)0x0)) {
    ppcVar10 = (*pgVar4->optional_classes)(pgVar4->xdata);
    pcVar7 = *ppcVar10;
    if (pcVar7 != (char *)0x0) {
      uVar14 = 1;
      do {
        pcVar7 = string_dup(pcVar7);
        sVar15 = parser->declarations->n;
        if (sVar15 == 0) {
          pgVar12 = (gnode_t *)0x0;
        }
        else {
          pgVar12 = parser->declarations->p[sVar15 - 1];
        }
        pgVar12 = gnode_variable_create
                            ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar7,(char *)0x0,(gnode_t *)0x0,
                             pgVar12,(gnode_variable_decl_t *)0x0);
        sVar15 = pgVar11->m;
        if (pgVar11->n == sVar15) {
          sVar16 = sVar15 * 2;
          if (sVar15 == 0) {
            sVar16 = 8;
          }
          pgVar11->m = sVar16;
          ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
          pgVar11->p = ppgVar13;
        }
        sVar15 = pgVar11->n;
        pgVar11->n = sVar15 + 1;
        pgVar11->p[sVar15] = pgVar12;
        pcVar7 = ppcVar10[uVar14];
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (pcVar7 != (char *)0x0);
    }
  }
  sVar15 = parser->declarations->n;
  if (sVar15 == 0) {
    pgVar12 = (gnode_t *)0x0;
  }
  else {
    pgVar12 = parser->declarations->p[sVar15 - 1];
  }
  pgVar12 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar11,
                       pgVar12);
  pgVar11 = parser->statements;
  sVar15 = pgVar11->m;
  if (pgVar11->n == sVar15) {
    sVar16 = 8;
    if (sVar15 != 0) {
      sVar16 = sVar15 * 2;
    }
    pgVar11->m = sVar16;
    ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
    parser->statements->p = ppgVar13;
  }
  pgVar11 = parser->statements;
  sVar15 = pgVar11->n;
  pgVar11->n = sVar15 + 1;
  pgVar11->p[sVar15] = pgVar12;
  tstart = nanotime();
  do {
    while (gVar6 = gravity_lexer_peek(parser->lexer->p[parser->lexer->n - 1]), gVar6 != TOK_EOF) {
      pgVar12 = parse_statement(parser);
      if (pgVar12 != (gnode_t *)0x0) {
        pgVar11 = parser->statements;
        sVar15 = pgVar11->m;
        if (pgVar11->n == sVar15) {
          sVar16 = sVar15 * 2;
          if (sVar15 == 0) {
            sVar16 = 8;
          }
          pgVar11->m = sVar16;
          ppgVar13 = (gnode_t **)realloc(pgVar11->p,sVar16 << 3);
          parser->statements->p = ppgVar13;
        }
        pgVar11 = parser->statements;
        sVar15 = pgVar11->n;
        pgVar11->n = sVar15 + 1;
        pgVar11->p[sVar15] = pgVar12;
      }
    }
    gravity_lexer_free(parser->lexer->p[parser->lexer->n - 1]);
    plVar1 = parser->lexer;
    plVar1->n = plVar1->n - 1;
  } while (plVar1->n != 0);
  tend = nanotime();
  dVar5 = millitime(tstart,tend);
  parser->time = dVar5;
  if (parser->nerrors == 0) {
    if (parser->declarations->n == 0) {
      pgVar12 = gnode_block_stat_create
                          (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,
                           (gnode_t *)0x0,0);
      return pgVar12;
    }
  }
  else {
    sVar15 = parser->declarations->n;
    if (sVar15 == 0) {
      pgVar12 = (gnode_t *)0x0;
    }
    else {
      pgVar12 = parser->declarations->p[sVar15 - 1];
    }
    pgVar12 = gnode_block_stat_create
                        (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,pgVar12,0)
    ;
    gnode_free(pgVar12);
  }
  return (gnode_t *)0x0;
}

Assistant:

gnode_t *gravity_parser_run (gravity_parser_t *parser, gravity_delegate_t *delegate) {
    parser->delegate = delegate;
    gravity_lexer_setdelegate(CURRENT_LEXER, delegate);

    // check if some user code needs to be prepended
    if ((delegate) && (delegate->precode_callback))
        parser_appendcode(delegate->precode_callback(delegate->xdata), parser);

    // if there are syntax errors then just returns
    if (parser_run(parser) > 0) {
        parser_cleanup (parser);
        return NULL;
    }

    // if there are some open declarations then there should be an error somewhere
    if (marray_size(*parser->declarations) > 0) return NULL;

    // return ast
    return gnode_block_stat_create(NODE_LIST_STAT, NO_TOKEN, parser->statements, NULL, 0);
}